

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_array_stride
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIRType *type_00;
  uint32_t alignment;
  uint32_t size;
  SPIRType *tmp;
  uint32_t parent;
  BufferPackingStandard packing_local;
  Bitset *flags_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
  if (uVar1 != 0) {
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
    uVar1 = type_to_packed_size(this,type_00,flags,packing);
    uVar2 = type_to_packed_alignment(this,type,flags,packing);
    return (uVar1 + uVar2) - 1 & (uVar2 - 1 ^ 0xffffffff);
  }
  __assert_fail("parent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x52b,
                "uint32_t spirv_cross::CompilerGLSL::type_to_packed_array_stride(const SPIRType &, const Bitset &, BufferPackingStandard)"
               );
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_array_stride(const SPIRType &type, const Bitset &flags,
                                                   BufferPackingStandard packing)
{
	// Array stride is equal to aligned size of the underlying type.
	uint32_t parent = type.parent_type;
	assert(parent);

	auto &tmp = get<SPIRType>(parent);

	uint32_t size = type_to_packed_size(tmp, flags, packing);
	uint32_t alignment = type_to_packed_alignment(type, flags, packing);
	return (size + alignment - 1) & ~(alignment - 1);
}